

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O2

void __thiscall reader_url_suite::test_fragment_plain::test_method(test_fragment_plain *this)

{
  bool bVar1;
  uint local_3a8;
  value local_3a4;
  view_type local_3a0;
  undefined8 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  url reader;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [35];
  
  local_3a0.ptr_ = input;
  builtin_strncpy(input,"scheme://example.com/path#fragment",0x23);
  local_3a0.len_ = strlen(local_3a0.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_3a0);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0xdd);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_3a4 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_3a8 = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_3a0,&local_88,0xdd,2,2,&local_3a4,"reader.subcode()",&local_3a8,
             "url::token::subcode::scheme");
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0xde);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_b0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
            (&local_3a0,&local_b8,0xde,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"scheme","\"scheme\"");
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0xdf);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_338 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_3a4 = CONCAT31(local_3a4._1_3_,bVar1);
  local_3a8 = CONCAT31(local_3a8._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_3a0,&local_340,0xdf,2,2,&local_3a4,"reader.next()",&local_3a8,"true");
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0xe0);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_3a4 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_3a8 = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_3a0,&local_108,0xe0,2,2,&local_3a4,"reader.subcode()",&local_3a8,
             "url::token::subcode::authority_host_name");
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0xe1);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_130 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[12]>
            (&local_3a0,&local_138,0xe1,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"example.com","\"example.com\"");
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0xe2);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_348 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_3a4 = CONCAT31(local_3a4._1_3_,bVar1);
  local_3a8 = CONCAT31(local_3a8._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_3a0,&local_350,0xe2,2,2,&local_3a4,"reader.next()",&local_3a8,"true");
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0xe3);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_3a4 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_3a8 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_3a0,&local_188,0xe3,2,2,&local_3a4,"reader.subcode()",&local_3a8,
             "url::token::subcode::path_segment");
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0xe4);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1b0 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
            (&local_3a0,&local_1b8,0xe4,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"path","\"path\"");
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0xe5);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_358 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_3a4 = CONCAT31(local_3a4._1_3_,bVar1);
  local_3a8 = CONCAT31(local_3a8._1_3_,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_3a0,&local_360,0xe5,2,2,&local_3a4,"reader.next()",&local_3a8,"true");
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0xe6);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_368 = "";
  local_3a4 = trial::url::token::category
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_3a8 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
            (&local_3a0,&local_370,0xe6,2,2,&local_3a4,"reader.category()",&local_3a8,
             "url::token::category::fragment");
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0xe7);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_220 = "";
  local_3a4 = trial::url::token::code
                        (reader.super_base<char,_trial::url::reader::basic_url>.current_token);
  local_3a8 = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
            (&local_3a0,&local_228,0xe7,2,2,&local_3a4,"reader.code()",&local_3a8,
             "url::token::code::fragment");
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0xe8);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_250 = "";
  local_3a4 = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_3a8 = 0xc;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
            (&local_3a0,&local_258,0xe8,2,2,&local_3a4,"reader.subcode()",&local_3a8,
             "url::token::subcode::fragment");
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0xe9);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_280 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[9]>
            (&local_3a0,&local_288,0xe9,2,2,
             &reader.super_base<char,_trial::url::reader::basic_url>.current_view,"reader.literal()"
             ,"fragment","\"fragment\"");
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_290 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0xea);
  local_3a0.len_ = local_3a0.len_ & 0xffffffffffffff00;
  local_3a0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_390 = &boost::unit_test::lazy_ostream::inst;
  local_388 = "";
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_378 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_3a4 = CONCAT31(local_3a4._1_3_,bVar1);
  local_3a8 = local_3a8 & 0xffffff00;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_3a0,&local_380,0xea,2,2,&local_3a4,"reader.next()",&local_3a8,"false");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_fragment_plain)
{
    const char input[] = "scheme://example.com/path#fragment";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::fragment);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::fragment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::fragment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "fragment");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}